

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O1

uint32_t __thiscall cfd::core::Psbt::GetTxOutCount(Psbt *this)

{
  long lVar1;
  CfdException *pCVar2;
  string local_40;
  
  if (this->wally_psbt_pointer_ == (void *)0x0) {
    local_40._M_dataplus._M_p = "cfdcore_psbt.cpp";
    local_40._M_string_length._0_4_ = 0x87e;
    local_40.field_2._M_allocated_capacity = (long)"CfdGetTxOutCount" + 3;
    logger::log<>((CfdSourceLocation *)&local_40,kCfdLogLevelWarning,"psbt pointer is null");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"psbt pointer is null.","");
    CfdException::CfdException(pCVar2,kCfdIllegalStateError,&local_40);
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  lVar1 = *(long *)((long)this->wally_psbt_pointer_ + 8);
  if (lVar1 != 0) {
    return *(uint32_t *)(lVar1 + 0x28);
  }
  local_40._M_dataplus._M_p = "cfdcore_psbt.cpp";
  local_40._M_string_length._0_4_ = 0x881;
  local_40.field_2._M_allocated_capacity = (long)"CfdGetTxOutCount" + 3;
  logger::log<>((CfdSourceLocation *)&local_40,kCfdLogLevelWarning,"psbt base tx is null");
  pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"psbt base tx is null.","");
  CfdException::CfdException(pCVar2,kCfdIllegalStateError,&local_40);
  __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

uint32_t Psbt::GetTxOutCount() const {
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  if (psbt_pointer == nullptr) {
    warn(CFD_LOG_SOURCE, "psbt pointer is null");
    throw CfdException(kCfdIllegalStateError, "psbt pointer is null.");
  } else if (psbt_pointer->tx == nullptr) {
    warn(CFD_LOG_SOURCE, "psbt base tx is null");
    throw CfdException(kCfdIllegalStateError, "psbt base tx is null.");
  }
  return static_cast<uint32_t>(psbt_pointer->tx->num_outputs);
}